

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

int __thiscall Map_Chest::AddItem(Map_Chest *this,short item_id,int amount,int slot)

{
  size_t *psVar1;
  list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *this_00;
  _List_node_base *p_Var2;
  int iVar3;
  int iVar4;
  Map_Chest_Item chestitem;
  value_type local_24;
  
  iVar3 = 0;
  iVar4 = 0;
  if (0 < amount) {
    iVar4 = iVar3;
    local_24.id = item_id;
    local_24.amount = amount;
    if (slot == 0) {
      this_00 = &this->items;
      p_Var2 = (_List_node_base *)this_00;
      do {
        p_Var2 = (((_List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *)&p_Var2->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var2 == (_List_node_base *)this_00) {
          if ((ulong)(long)this->chestslots <=
              (this->items).super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>.
              _M_impl._M_node._M_size) {
            return 0;
          }
          if (this->maxchest < amount) {
            return 0;
          }
          p_Var2 = (this_00->super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>).
                   _M_impl._M_node.super__List_node_base._M_next;
          iVar4 = 0;
          if (p_Var2 != (_List_node_base *)this_00) {
            iVar4 = 0;
            do {
              iVar4 = iVar4 + (uint)(*(int *)&p_Var2[1]._M_prev == 0);
              p_Var2 = p_Var2->_M_next;
            } while (p_Var2 != (_List_node_base *)this_00);
          }
          if (this->chestslots <= iVar4 + this->slots) {
            return 0;
          }
          local_24.slot = 0;
          std::__cxx11::list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>::push_back
                    (this_00,&local_24);
          return amount;
        }
      } while (*(short *)&p_Var2[1]._M_next != item_id);
      iVar3 = *(int *)((long)&p_Var2[1]._M_next + 4) + amount;
      if ((-1 < iVar3) && (iVar3 <= this->maxchest)) {
        *(int *)((long)&p_Var2[1]._M_next + 4) = iVar3;
        iVar4 = amount;
      }
    }
    else {
      iVar4 = 0;
      if (((this->items).super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>._M_impl.
           _M_node._M_size < (ulong)(long)this->chestslots) &&
         (iVar4 = iVar3, amount <= this->maxchest)) {
        local_24.slot = slot;
        p_Var2 = (_List_node_base *)operator_new(0x20);
        p_Var2[1]._M_next =
             (_List_node_base *)CONCAT44(local_24.amount,CONCAT22(local_24._2_2_,local_24.id));
        *(int *)&p_Var2[1]._M_prev = local_24.slot;
        std::__detail::_List_node_base::_M_hook(p_Var2);
        psVar1 = &(this->items).super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>.
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        iVar4 = amount;
      }
    }
  }
  return iVar4;
}

Assistant:

int Map_Chest::AddItem(short item_id, int amount, int slot)
{
	if (amount <= 0)
	{
		return 0;
	}

	if (slot == 0)
	{
		UTIL_FOREACH_REF(this->items, item)
		{
			if (item.id == item_id)
			{
				if (item.amount + amount < 0 || item.amount + amount > this->maxchest)
				{
					return 0;
				}

				item.amount += amount;
				return amount;
			}
		}
	}

	if (this->items.size() >= static_cast<std::size_t>(this->chestslots) || amount > this->maxchest)
	{
		return 0;
	}

	if (slot == 0)
	{
		int user_items = 0;

		UTIL_FOREACH(this->items, item)
		{
			if (item.slot == 0)
			{
				++user_items;
			}
		}

		if (user_items + this->slots >= this->chestslots)
		{
			return 0;
		}
	}

	Map_Chest_Item chestitem;
	chestitem.id = item_id;
	chestitem.amount = amount;
	chestitem.slot = slot;

	if (slot == 0)
	{
		this->items.push_back(chestitem);
	}
	else
	{
		this->items.push_front(chestitem);
	}

	return amount;
}